

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedPrimitive::
GenerateSerializeWithCachedSizesToArray(RepeatedPrimitive *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *pPVar1;
  bool bVar2;
  Type type;
  optional<unsigned_long> oVar3;
  Sub *local_1d0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  undefined1 local_181;
  anon_class_16_2_fd512ddd_for_cb local_180 [2];
  allocator<char> local_159;
  string local_158;
  Sub *local_138;
  Sub local_130;
  iterator local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_68;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  optional<unsigned_long> local_40;
  undefined1 local_28 [16];
  Printer *local_18;
  Printer *p_local;
  RepeatedPrimitive *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldDescriptor::is_packed((this->super_FieldGeneratorBase).field_);
  pPVar1 = local_18;
  if (bVar2) {
    type = FieldDescriptor::type((this->super_FieldGeneratorBase).field_);
    oVar3 = FixedSize(type);
    local_40.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_40.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar2 = std::optional<unsigned_long>::has_value(&local_40);
    pPVar1 = local_18;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_50,
                 "\n      if (this_._internal_$name$_size() > 0) {\n        target = stream->WriteFixedPacked($number$, this_._internal_$name$(), target);\n      }\n    "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_50._M_len,local_50._M_str);
    }
    else {
      local_181 = 1;
      local_138 = &local_130;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"byte_size",&local_159);
      local_180[0].p = &local_18;
      local_180[0].this = this;
      protobuf::io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::RepeatedPrimitive::GenerateSerializeWithCachedSizesToArray(google::protobuf::io::Printer*)const::__0>
                (&local_130,&local_158,local_180);
      local_181 = 0;
      local_78 = &local_130;
      local_70 = 1;
      v._M_len = 1;
      v._M_array = local_78;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_68._M_local_buf,v);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_198,
                 "\n        {\n          int byte_size = $byte_size$;\n          if (byte_size > 0) {\n            target = stream->Write$DeclaredType$Packed(\n                $number$, this_._internal_$name$(), byte_size, target);\n          }\n        }\n      "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit
                (pPVar1,local_68._M_allocated_capacity,local_68._8_8_,local_198._M_len,
                 local_198._M_str);
      local_1d0 = (Sub *)&local_78;
      do {
        local_1d0 = local_1d0 + -1;
        protobuf::io::Printer::Sub::~Sub(local_1d0);
      } while (local_1d0 != &local_130);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_28,
               "\n      for (int i = 0, n = this_._internal_$name$_size(); i < n; ++i) {\n        target = stream->EnsureSpace(target);\n        target = ::_pbi::WireFormatLite::Write$DeclaredType$ToArray(\n            $number$, this_._internal_$name$().Get(i), target);\n      }\n    "
              );
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit(pPVar1,local_28._0_8_,local_28._8_8_);
  }
  return;
}

Assistant:

void RepeatedPrimitive::GenerateSerializeWithCachedSizesToArray(
    io::Printer* p) const {
  if (!field_->is_packed()) {
    p->Emit(R"cc(
      for (int i = 0, n = this_._internal_$name$_size(); i < n; ++i) {
        target = stream->EnsureSpace(target);
        target = ::_pbi::WireFormatLite::Write$DeclaredType$ToArray(
            $number$, this_._internal_$name$().Get(i), target);
      }
    )cc");
    return;
  }

  if (FixedSize(field_->type()).has_value()) {
    p->Emit(R"cc(
      if (this_._internal_$name$_size() > 0) {
        target = stream->WriteFixedPacked($number$, this_._internal_$name$(), target);
      }
    )cc");
    return;
  }

  p->Emit(
      {
          {"byte_size",
           [&] {
             if (HasCachedSize()) {
               p->Emit(R"cc(this_.$_field_cached_byte_size_$.Get();)cc");
             } else {
               p->Emit(R"cc(
                 ::_pbi::WireFormatLite::$DeclaredType$Size(
                     this_._internal_$name$());
               )cc");
             }
           }},
      },
      R"cc(
        {
          int byte_size = $byte_size$;
          if (byte_size > 0) {
            target = stream->Write$DeclaredType$Packed(
                $number$, this_._internal_$name$(), byte_size, target);
          }
        }
      )cc");
}